

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double fppow2(int n)

{
  int iVar1;
  double dVar2;
  
  iVar1 = -n;
  if (0 < n) {
    iVar1 = n;
  }
  dVar2 = 1.0;
  for (; 0 < iVar1; iVar1 = iVar1 + -1) {
    dVar2 = dVar2 * *(double *)(&DAT_0016e940 + (ulong)((uint)n >> 0x1f) * 8);
  }
  return dVar2;
}

Assistant:

double fppow2(int n)
{
  double x, power;
  x = (n < 0) ? ((double)1.0/(double)2.0) : (double)2.0;
  n = (n < 0) ? -n : n;
  power = (double)1.0;
  while (n-- > 0)
	power *= x;
  return (power);
}